

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::PulseStyleDeclarationSyntax::PulseStyleDeclarationSyntax
          (PulseStyleDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *inputs,Token semi)

{
  size_t sVar1;
  pointer ppAVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar6 = keyword._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = PulseStyleDeclaration;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00cb68b8;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00cb67f8;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar7 = 0;
    do {
      *(PulseStyleDeclarationSyntax **)(*(long *)((long)ppAVar2 + lVar7) + 8) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->keyword).kind = (short)uVar6;
  (this->keyword).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->keyword).info = keyword.info;
  uVar4 = *(undefined4 *)&(inputs->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (inputs->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.kind =
       (inputs->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->inputs).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (inputs->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->inputs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00cb68b8;
  (this->inputs).super_SyntaxListBase.childCount = (inputs->super_SyntaxListBase).childCount;
  (this->inputs).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00cbec28;
  sVar1 = (inputs->elements)._M_extent._M_extent_value;
  (this->inputs).elements._M_ptr = (inputs->elements)._M_ptr;
  (this->inputs).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar8 = (this->inputs).elements._M_extent._M_extent_value + 1;
  if (1 < uVar8) {
    uVar8 = uVar8 >> 1;
    lVar7 = 0;
    do {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->inputs).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      (*ppSVar5)->parent = (SyntaxNode *)this;
      lVar7 = lVar7 + 0x30;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

PulseStyleDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<NameSyntax>& inputs, Token semi) :
        MemberSyntax(SyntaxKind::PulseStyleDeclaration, attributes), keyword(keyword), inputs(inputs), semi(semi) {
        this->inputs.parent = this;
        for (auto child : this->inputs)
            child->parent = this;
    }